

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O2

void __thiscall
wasm::ShellExternalInterface::store128
          (ShellExternalInterface *this,Address addr,array<unsigned_char,_16UL> *value,
          Name memoryName)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  iterator iVar3;
  undefined1 local_30 [8];
  Name memoryName_local;
  
  memoryName_local.super_IString.str._M_len = memoryName.super_IString.str._M_str;
  local_30 = memoryName.super_IString.str._M_len;
  iVar3 = std::
          _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::ShellExternalInterface::Memory>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::ShellExternalInterface::Memory>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::ShellExternalInterface::Memory>_>_>
          ::find(&(this->memories)._M_t,(key_type *)local_30);
  if ((_Rb_tree_header *)iVar3._M_node != &(this->memories)._M_t._M_impl.super__Rb_tree_header) {
    uVar2 = *(undefined8 *)(value->_M_elems + 8);
    puVar1 = (undefined8 *)((long)&(iVar3._M_node[1]._M_left)->_M_color + addr.addr);
    *puVar1 = *(undefined8 *)value->_M_elems;
    puVar1[1] = uVar2;
    return;
  }
  __assert_fail("it != memories.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/shell-interface.h"
                ,0x119,
                "virtual void wasm::ShellExternalInterface::store128(Address, const std::array<uint8_t, 16> &, Name)"
               );
}

Assistant:

void store128(Address addr,
                const std::array<uint8_t, 16>& value,
                Name memoryName) override {
    auto it = memories.find(memoryName);
    assert(it != memories.end());
    auto& memory = it->second;
    memory.set<std::array<uint8_t, 16>>(addr, value);
  }